

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcppacketbuilder.cpp
# Opt level: O3

int __thiscall
jrtplib::RTCPPacketBuilder::BuildNextPacket(RTCPPacketBuilder *this,RTCPCompoundPacket **pack)

{
  RTPMemoryManager *pRVar1;
  RTPInternalSourceData *pRVar2;
  RTPPacketBuilder *pRVar3;
  uint8_t *itemdata;
  size_t sVar4;
  _func_int **pp_Var5;
  int iVar6;
  uint32_t uVar7;
  RTCPCompoundPacketBuilder *this_00;
  uint32_t senderssrc;
  int iVar8;
  uint32_t packetcount;
  uint32_t octetcount;
  char cVar9;
  RTCPCompoundPacket **ppRVar10;
  bool bVar11;
  double dVar12;
  double dVar13;
  bool processedall;
  bool full;
  bool atendoflist;
  bool atendoflist_2;
  RTCPCompoundPacket **local_68;
  int added;
  int skipped;
  timespec tpMono_1;
  RTPTime curtime;
  long local_40;
  
  if (this->init != true) {
    return -0x32;
  }
  *pack = (RTCPCompoundPacket *)0x0;
  pRVar1 = (this->super_RTPMemoryObject).mgr;
  if (pRVar1 == (RTPMemoryManager *)0x0) {
    this_00 = (RTCPCompoundPacketBuilder *)operator_new(0x130);
  }
  else {
    this_00 = (RTCPCompoundPacketBuilder *)(**(code **)(*(long *)pRVar1 + 0x10))(pRVar1,0x130,0x11);
  }
  RTCPCompoundPacketBuilder::RTCPCompoundPacketBuilder(this_00,(this->super_RTPMemoryObject).mgr);
  if (this_00 == (RTCPCompoundPacketBuilder *)0x0) {
    return -1;
  }
  iVar6 = RTCPCompoundPacketBuilder::InitBuild(this_00,this->maxpacketsize);
  if (-1 < iVar6) {
    pRVar2 = this->sources->owndata;
    senderssrc = 0;
    if (pRVar2 == (RTPInternalSourceData *)0x0) {
      cVar9 = '\0';
    }
    else {
      cVar9 = (pRVar2->super_RTPSourceData).issender;
    }
    if (this->rtppacketbuilder->init != false) {
      senderssrc = this->rtppacketbuilder->ssrc;
    }
    local_68 = pack;
    if (RTPTime::CurrentTime()::s_initialized == '\0') {
      RTPTime::CurrentTime()::s_initialized = '\x01';
      clock_gettime(0,(timespec *)&curtime);
      clock_gettime(1,(timespec *)&tpMono_1);
      dVar13 = (double)local_40 * 1e-09 + (double)curtime.m_t;
      RTPTime::CurrentTime()::s_startOffet =
           dVar13 - ((double)tpMono_1.tv_nsec * 1e-09 + (double)tpMono_1.tv_sec);
    }
    else {
      clock_gettime(1,(timespec *)&curtime);
      dVar13 = (double)local_40 * 1e-09 + (double)curtime.m_t + RTPTime::CurrentTime()::s_startOffet
      ;
    }
    curtime.m_t = dVar13;
    if (cVar9 == '\0') {
      iVar6 = RTCPCompoundPacketBuilder::StartReceiverReport(this_00,senderssrc);
      if (iVar6 < 0) {
        pRVar1 = (this->super_RTPMemoryObject).mgr;
        pp_Var5 = (this_00->super_RTCPCompoundPacket).super_RTPMemoryObject._vptr_RTPMemoryObject;
        goto joined_r0x0012a640;
      }
    }
    else {
      pRVar3 = this->rtppacketbuilder;
      uVar7 = 0;
      bVar11 = pRVar3->init != false;
      if (bVar11) {
        dVar12 = (pRVar3->lastwallclocktime).m_t;
      }
      else {
        dVar12 = 0.0;
      }
      packetcount = 0;
      octetcount = 0;
      if (bVar11) {
        uVar7 = pRVar3->lastrtptimestamp;
        packetcount = pRVar3->numpackets;
        octetcount = pRVar3->numpayloadbytes;
      }
      tpMono_1.tv_sec =
           (ulong)((int)(long)dVar13 + 0x83aa7e80) |
           (long)(((double)((long)((dVar13 - (double)((long)dVar13 & 0xffffffff)) * 1000000.0) &
                           0xffffffff) / 1000000.0) * 4294967296.0) << 0x20;
      iVar6 = RTCPCompoundPacketBuilder::StartSenderReport
                        (this_00,senderssrc,(RTPNTPTime *)&tpMono_1,
                         (int)(long)(((dVar13 - dVar12) + (this->transmissiondelay).m_t) /
                                     this->timestampunit + 0.5) + uVar7,packetcount,octetcount);
      if (iVar6 < 0) {
        pRVar1 = (this->super_RTPMemoryObject).mgr;
        pp_Var5 = (this_00->super_RTCPCompoundPacket).super_RTPMemoryObject._vptr_RTPMemoryObject;
        goto joined_r0x0012a640;
      }
    }
    itemdata = (this->ownsdesinfo).super_RTCPSDESInfo.nonprivateitems[0].str;
    sVar4 = (this->ownsdesinfo).super_RTCPSDESInfo.nonprivateitems[0].length;
    iVar6 = RTCPCompoundPacketBuilder::AddSDESSource(this_00,senderssrc);
    if (iVar6 < 0) {
      pRVar1 = (this->super_RTPMemoryObject).mgr;
      pp_Var5 = (this_00->super_RTCPCompoundPacket).super_RTPMemoryObject._vptr_RTPMemoryObject;
    }
    else {
      iVar6 = RTCPCompoundPacketBuilder::AddSDESNormalItem(this_00,CNAME,itemdata,(uint8_t)sVar4);
      if (-1 < iVar6) {
        if (this->processingsdes == false) {
          iVar6 = FillInReportBlocks(this,this_00,&curtime,this->sources->totalcount,&processedall,
                                     (int *)&tpMono_1,&added,&full);
          if (iVar6 < 0) {
            pRVar1 = (this->super_RTPMemoryObject).mgr;
            pp_Var5 = (this_00->super_RTCPCompoundPacket).super_RTPMemoryObject.
                      _vptr_RTPMemoryObject;
            goto joined_r0x0012a523;
          }
          if ((processedall == true) && ((int)tpMono_1.tv_sec == 0)) {
            pRVar1 = (this->super_RTPMemoryObject).mgr;
            pp_Var5 = (this_00->super_RTCPCompoundPacket).super_RTPMemoryObject.
                      _vptr_RTPMemoryObject;
            goto joined_r0x0012a8a2;
          }
          ppRVar10 = local_68;
          if (processedall == false) {
            this->processingsdes = true;
            this->sdesbuildcount = this->sdesbuildcount + 1;
            ClearAllSourceFlags(this);
            this->dotool = false;
            this->donote = false;
            this->doname = false;
            this->doemail = false;
            this->doloc = false;
            this->dophone = false;
            if ((0 < this->interval_name) && (this->sdesbuildcount % this->interval_name == 0)) {
              this->doname = true;
            }
            if ((0 < this->interval_email) && (this->sdesbuildcount % this->interval_email == 0)) {
              this->doemail = true;
            }
            if ((0 < this->interval_location) &&
               (this->sdesbuildcount % this->interval_location == 0)) {
              this->doloc = true;
            }
            if ((0 < this->interval_phone) && (this->sdesbuildcount % this->interval_phone == 0)) {
              this->dophone = true;
            }
            if ((0 < this->interval_tool) && (this->sdesbuildcount % this->interval_tool == 0)) {
              this->dotool = true;
            }
            if ((0 < this->interval_note) && (this->sdesbuildcount % this->interval_note == 0)) {
              this->donote = true;
            }
            FillInSDES(this,this_00,&processedall,&atendoflist,&skipped);
            ppRVar10 = local_68;
            if (atendoflist == true) {
              this->processingsdes = false;
              (this->ownsdesinfo).pname = false;
              (this->ownsdesinfo).pemail = false;
              (this->ownsdesinfo).plocation = false;
              (this->ownsdesinfo).pphone = false;
              (this->ownsdesinfo).ptool = false;
              (this->ownsdesinfo).pnote = false;
              if ((0 < added && processedall == false) &&
                 (iVar6 = FillInReportBlocks(this,this_00,&curtime,added,&processedall,
                                             (int *)&tpMono_1,&added,&atendoflist_2),
                 ppRVar10 = local_68, iVar6 < 0)) {
                pRVar1 = (this->super_RTPMemoryObject).mgr;
                pp_Var5 = (this_00->super_RTCPCompoundPacket).super_RTPMemoryObject.
                          _vptr_RTPMemoryObject;
                goto joined_r0x0012a523;
              }
            }
          }
        }
        else {
          FillInSDES(this,this_00,&full,&processedall,(int *)&tpMono_1);
          if ((int)tpMono_1.tv_sec == 0) {
            pRVar1 = (this->super_RTPMemoryObject).mgr;
            pp_Var5 = (this_00->super_RTCPCompoundPacket).super_RTPMemoryObject.
                      _vptr_RTPMemoryObject;
joined_r0x0012a8a2:
            if (pRVar1 == (RTPMemoryManager *)0x0) {
              (*pp_Var5[1])(this_00);
            }
            else {
              (**pp_Var5)(this_00);
              (**(code **)(*(long *)pRVar1 + 0x18))(pRVar1,this_00);
            }
            return -0x33;
          }
          ppRVar10 = local_68;
          if (processedall == true) {
            this->processingsdes = false;
            (this->ownsdesinfo).pname = false;
            (this->ownsdesinfo).pemail = false;
            (this->ownsdesinfo).plocation = false;
            (this->ownsdesinfo).pphone = false;
            (this->ownsdesinfo).ptool = false;
            (this->ownsdesinfo).pnote = false;
            if (full == false) {
              iVar6 = FillInReportBlocks(this,this_00,&curtime,this->sources->totalcount,&full,
                                         &added,&skipped,&atendoflist);
              ppRVar10 = local_68;
              if (iVar6 < 0) {
                pRVar1 = (this->super_RTPMemoryObject).mgr;
                pp_Var5 = (this_00->super_RTCPCompoundPacket).super_RTPMemoryObject.
                          _vptr_RTPMemoryObject;
                goto joined_r0x0012a523;
              }
              if (atendoflist == true) {
                ClearAllSourceFlags(this);
              }
            }
          }
        }
        iVar6 = RTCPCompoundPacketBuilder::EndBuild(this_00);
        if (-1 < iVar6) {
          *ppRVar10 = &this_00->super_RTCPCompoundPacket;
          this->firstpacket = false;
          (this->prevbuildtime).m_t = dVar13;
          return 0;
        }
        pRVar1 = (this->super_RTPMemoryObject).mgr;
        pp_Var5 = (this_00->super_RTCPCompoundPacket).super_RTPMemoryObject._vptr_RTPMemoryObject;
        goto joined_r0x0012a523;
      }
      pRVar1 = (this->super_RTPMemoryObject).mgr;
      pp_Var5 = (this_00->super_RTCPCompoundPacket).super_RTPMemoryObject._vptr_RTPMemoryObject;
    }
joined_r0x0012a640:
    if (pRVar1 == (RTPMemoryManager *)0x0) {
      (*pp_Var5[1])(this_00);
    }
    else {
      (**pp_Var5)(this_00);
      (**(code **)(*(long *)pRVar1 + 0x18))(pRVar1,this_00);
    }
    iVar8 = -0x33;
    if (iVar6 != -0x2b) {
      iVar8 = iVar6;
    }
    return iVar8;
  }
  pRVar1 = (this->super_RTPMemoryObject).mgr;
  pp_Var5 = (this_00->super_RTCPCompoundPacket).super_RTPMemoryObject._vptr_RTPMemoryObject;
joined_r0x0012a523:
  if (pRVar1 != (RTPMemoryManager *)0x0) {
    (**pp_Var5)(this_00);
    (**(code **)(*(long *)pRVar1 + 0x18))(pRVar1,this_00);
    return iVar6;
  }
  (*pp_Var5[1])(this_00);
  return iVar6;
}

Assistant:

int RTCPPacketBuilder::BuildNextPacket(RTCPCompoundPacket **pack)
{
	if (!init)
		return ERR_RTP_RTCPPACKETBUILDER_NOTINIT;

	RTCPCompoundPacketBuilder *rtcpcomppack;
	int status;
	bool sender = false;
	RTPSourceData *srcdat;
	
	*pack = 0;
	
	rtcpcomppack = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTCPCOMPOUNDPACKETBUILDER) RTCPCompoundPacketBuilder(GetMemoryManager());
	if (rtcpcomppack == 0)
		return ERR_RTP_OUTOFMEM;
	
	if ((status = rtcpcomppack->InitBuild(maxpacketsize)) < 0)
	{
		RTPDelete(rtcpcomppack,GetMemoryManager());
		return status;
	}
	
	if ((srcdat = sources.GetOwnSourceInfo()) != 0)
	{
		if (srcdat->IsSender())
			sender = true;
	}
	
	uint32_t ssrc = rtppacketbuilder.GetSSRC();
	RTPTime curtime = RTPTime::CurrentTime();

	if (sender)
	{
		RTPTime rtppacktime = rtppacketbuilder.GetPacketTime();
		uint32_t rtppacktimestamp = rtppacketbuilder.GetPacketTimestamp();
		uint32_t packcount = rtppacketbuilder.GetPacketCount();
		uint32_t octetcount = rtppacketbuilder.GetPayloadOctetCount();
		RTPTime diff = curtime;
		diff -= rtppacktime;
		diff += transmissiondelay; // the sample being sampled at this very instant will need a larger timestamp
		
		uint32_t tsdiff = (uint32_t)((diff.GetDouble()/timestampunit)+0.5);
		uint32_t rtptimestamp = rtppacktimestamp+tsdiff;
		RTPNTPTime ntptimestamp = curtime.GetNTPTime();

		if ((status = rtcpcomppack->StartSenderReport(ssrc,ntptimestamp,rtptimestamp,packcount,octetcount)) < 0)
		{
			RTPDelete(rtcpcomppack,GetMemoryManager());
			if (status == ERR_RTP_RTCPCOMPPACKBUILDER_NOTENOUGHBYTESLEFT)
				return ERR_RTP_RTCPPACKETBUILDER_PACKETFILLEDTOOSOON;
			return status;
		}
	}
	else
	{
		if ((status = rtcpcomppack->StartReceiverReport(ssrc)) < 0)
		{
			RTPDelete(rtcpcomppack,GetMemoryManager());
			if (status == ERR_RTP_RTCPCOMPPACKBUILDER_NOTENOUGHBYTESLEFT)
				return ERR_RTP_RTCPPACKETBUILDER_PACKETFILLEDTOOSOON;
			return status;
		}
	}

	uint8_t *owncname;
	size_t owncnamelen;

	owncname = ownsdesinfo.GetCNAME(&owncnamelen);

	if ((status = rtcpcomppack->AddSDESSource(ssrc)) < 0)
	{
		RTPDelete(rtcpcomppack,GetMemoryManager());
		if (status == ERR_RTP_RTCPCOMPPACKBUILDER_NOTENOUGHBYTESLEFT)
			return ERR_RTP_RTCPPACKETBUILDER_PACKETFILLEDTOOSOON;
		return status;
	}
	if ((status = rtcpcomppack->AddSDESNormalItem(RTCPSDESPacket::CNAME,owncname,owncnamelen)) < 0)
	{
		RTPDelete(rtcpcomppack,GetMemoryManager());
		if (status == ERR_RTP_RTCPCOMPPACKBUILDER_NOTENOUGHBYTESLEFT)
			return ERR_RTP_RTCPPACKETBUILDER_PACKETFILLEDTOOSOON;
		return status;
	}

	if (!processingsdes)
	{
		int added,skipped;
		bool full,atendoflist;

		if ((status = FillInReportBlocks(rtcpcomppack,curtime,sources.GetTotalCount(),&full,&added,&skipped,&atendoflist)) < 0)
		{
			RTPDelete(rtcpcomppack,GetMemoryManager());
			return status;
		}
		
		if (full && added == 0)
		{
			RTPDelete(rtcpcomppack,GetMemoryManager());
			return ERR_RTP_RTCPPACKETBUILDER_PACKETFILLEDTOOSOON;
		}
	
		if (!full)
		{
			processingsdes = true;
			sdesbuildcount++;
			
			ClearAllSourceFlags();
	
			doname = false;
			doemail = false;
			doloc = false;
			dophone = false;
			dotool = false;
			donote = false;
			if (interval_name > 0 && ((sdesbuildcount%interval_name) == 0)) doname = true;
			if (interval_email > 0 && ((sdesbuildcount%interval_email) == 0)) doemail = true;
			if (interval_location > 0 && ((sdesbuildcount%interval_location) == 0)) doloc = true;
			if (interval_phone > 0 && ((sdesbuildcount%interval_phone) == 0)) dophone = true;
			if (interval_tool > 0 && ((sdesbuildcount%interval_tool) == 0)) dotool = true;
			if (interval_note > 0 && ((sdesbuildcount%interval_note) == 0)) donote = true;
			
			bool processedall;
			int itemcount;
			
			if ((status = FillInSDES(rtcpcomppack,&full,&processedall,&itemcount)) < 0)
			{
				RTPDelete(rtcpcomppack,GetMemoryManager());
				return status;
			}

			if (processedall)
			{
				processingsdes = false;
				ClearAllSDESFlags();
				if (!full && skipped > 0) 
				{
					// if the packet isn't full and we skipped some
				        // sources that we already got in a previous packet,
					// we can add some of them now
					
					bool atendoflist;
					 
					if ((status = FillInReportBlocks(rtcpcomppack,curtime,skipped,&full,&added,&skipped,&atendoflist)) < 0)
					{
						RTPDelete(rtcpcomppack,GetMemoryManager());
						return status;
					}
				}
			}
		}
	}
	else // previous sdes processing wasn't finished
	{
		bool processedall;
		int itemcount;
		bool full;
			
		if ((status = FillInSDES(rtcpcomppack,&full,&processedall,&itemcount)) < 0)
		{
			RTPDelete(rtcpcomppack,GetMemoryManager());
			return status;
		}

		if (itemcount == 0) // Big problem: packet size is too small to let any progress happen
		{
			RTPDelete(rtcpcomppack,GetMemoryManager());
			return ERR_RTP_RTCPPACKETBUILDER_PACKETFILLEDTOOSOON;
		}

		if (processedall)
		{
			processingsdes = false;
			ClearAllSDESFlags();
			if (!full) 
			{
				// if the packet isn't full and we skipped some
				// we can add some report blocks
				
				int added,skipped;
				bool atendoflist;

				if ((status = FillInReportBlocks(rtcpcomppack,curtime,sources.GetTotalCount(),&full,&added,&skipped,&atendoflist)) < 0)
				{
					RTPDelete(rtcpcomppack,GetMemoryManager());
					return status;
				}
				if (atendoflist) // filled in all possible sources
					ClearAllSourceFlags();
			}
		}
	}
		
	if ((status = rtcpcomppack->EndBuild()) < 0)
	{
		RTPDelete(rtcpcomppack,GetMemoryManager());
		return status;
	}

	*pack = rtcpcomppack;
	firstpacket = false;
	prevbuildtime = curtime;
	return 0;
}